

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaForce.c
# Opt level: O2

int Frc_ManPlaceDfsBoth(Frc_Man_t *p,Vec_Int_t *vCoOrder,int *piCutSize2)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar1 = Frc_ManCrossCut(p,vCoOrder,0);
  Vec_IntReverseOrder(vCoOrder);
  iVar2 = Frc_ManCrossCut(p,vCoOrder,0);
  if (iVar2 < iVar1) {
    Frc_ManPlaceDfs(p,vCoOrder);
    Vec_IntReverseOrder(vCoOrder);
    iVar3 = iVar2;
    iVar2 = iVar1;
  }
  else {
    Vec_IntReverseOrder(vCoOrder);
    Frc_ManPlaceDfs(p,vCoOrder);
    iVar3 = iVar1;
  }
  *piCutSize2 = iVar2;
  return iVar3;
}

Assistant:

int Frc_ManPlaceDfsBoth( Frc_Man_t * p, Vec_Int_t * vCoOrder, int * piCutSize2 )
{
    int nCutStart1, nCutStart2;
    nCutStart1 = Frc_ManCrossCut( p, vCoOrder, 0 );
    Vec_IntReverseOrder( vCoOrder );
    nCutStart2 = Frc_ManCrossCut( p, vCoOrder, 0 );
    if ( nCutStart1 <= nCutStart2 )
    {
        Vec_IntReverseOrder( vCoOrder ); // undo
        Frc_ManPlaceDfs( p, vCoOrder );
        *piCutSize2 = nCutStart2;
        return nCutStart1;
    }
    else
    {
        Frc_ManPlaceDfs( p, vCoOrder );
        Vec_IntReverseOrder( vCoOrder ); // undo
        *piCutSize2 = nCutStart1;
        return nCutStart2;
    }
}